

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cc
# Opt level: O1

int Bits::CountLeadingZeros32_Portable(uint32 n)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  if (n == 0) {
    return 0x20;
  }
  uVar2 = n << 0x10;
  if (n >= 0x10000) {
    uVar2 = n;
  }
  uVar3 = (uint)(n < 0x10000) * 0x10;
  uVar4 = uVar3 | 9;
  uVar1 = uVar2 << 8;
  if (0xffffff < uVar2) {
    uVar4 = uVar3 + 1;
    uVar1 = uVar2;
  }
  uVar2 = uVar1 << 4;
  if (0xfffffff < uVar1) {
    uVar2 = uVar1;
  }
  uVar3 = uVar4 + 4;
  if (0xfffffff < uVar1) {
    uVar3 = uVar4;
  }
  uVar4 = uVar3 + 2;
  uVar1 = uVar2 * 4;
  if (0x3fffffff < uVar2) {
    uVar4 = uVar3;
    uVar1 = uVar2;
  }
  return ((int)uVar1 >> 0x1f) + uVar4;
}

Assistant:

int Bits::CountLeadingZeros32_Portable(uint32 n) {
  int bits = 1;
  if (n == 0)
    return 32;
  if ((n >> 16) == 0) {
    bits += 16;
    n <<= 16;
  }
  if ((n >> 24) == 0) {
    bits += 8;
    n <<= 8;
  }
  if ((n >> 28) == 0) {
    bits += 4;
    n <<= 4;
  }
  if ((n >> 30) == 0) {
    bits += 2;
    n <<= 2;
  }
  return bits - (n >> 31);
}